

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdkanji.c
# Opt level: O1

void do_convert(uchar **to_p,uchar **from_p,char *code)

{
  byte bVar1;
  uchar *__dest;
  byte *__src;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  byte bVar7;
  byte *pbVar8;
  byte bVar9;
  bool bVar10;
  
  __dest = *to_p;
  __src = *from_p;
  iVar3 = strcmp(code,"JIS7");
  if ((iVar3 == 0) || (iVar3 = strcmp(code,"jis"), iVar3 == 0)) {
    bVar7 = *__src;
    if (bVar7 != 0) {
      bVar10 = false;
      bVar2 = false;
      iVar3 = 0;
      lVar6 = 0;
      pbVar8 = __src;
      do {
        iVar4 = (int)lVar6;
        if (bVar7 == 0x1b) {
          if (__src[(long)iVar4 + 1] == 0x28) {
            bVar10 = __src[(long)iVar4 + 2] == 0x49;
            iVar5 = iVar3;
            iVar4 = iVar4 + 2;
LAB_00123061:
            bVar2 = false;
            iVar3 = iVar5;
          }
          else {
            if (__src[(long)iVar4 + 1] == 0x24) {
              iVar4 = iVar4 + 2;
              bVar10 = false;
              goto LAB_0012302a;
            }
            iVar4 = iVar4 + 1;
          }
        }
        else {
          if (!bVar2) {
            if (!bVar10) {
              lVar6 = (long)iVar3;
              iVar3 = iVar3 + 1;
              __dest[lVar6] = bVar7;
              bVar2 = false;
              bVar10 = false;
              goto LAB_00123079;
            }
            __dest[iVar3] = 0x8e;
            iVar5 = iVar3 + 2;
            __dest[(long)iVar3 + 1] = *pbVar8 + 0x80;
            bVar10 = true;
            goto LAB_00123061;
          }
          lVar6 = (long)iVar3;
          iVar3 = iVar3 + 1;
          __dest[lVar6] = bVar7 + 0x80;
LAB_0012302a:
          bVar2 = true;
        }
LAB_00123079:
        lVar6 = (long)iVar4;
        bVar7 = __src[lVar6 + 1];
        if (bVar7 == 0) break;
        pbVar8 = __src + lVar6 + 1;
        lVar6 = lVar6 + 1;
      } while (iVar3 < 0x2000);
      goto LAB_00123154;
    }
  }
  else {
    iVar3 = strcmp(code,"SJIS");
    if (iVar3 != 0) {
      gd_error("invalid code specification: \"%s\"",code);
      return;
    }
    bVar7 = *__src;
    if (bVar7 != 0) {
      lVar6 = 0;
      iVar4 = 0;
      do {
        iVar5 = (int)lVar6;
        if (bVar7 < 0x7f) {
          iVar3 = iVar4 + 1;
          __dest[iVar4] = bVar7;
        }
        else if ((byte)(bVar7 + 0x5f) < 0x3f) {
          __dest[iVar4] = 0x8e;
          iVar3 = iVar4 + 2;
          __dest[(long)iVar4 + 1] = bVar7;
        }
        else {
          bVar1 = __src[(long)iVar5 + 1];
          iVar5 = iVar5 + 1;
          bVar9 = bVar1 >> 7 ^ 0xe1;
          if (bVar1 >= 0x9f) {
            bVar9 = 0x82;
          }
          __dest[iVar4] = (((0x9f < bVar7) * '@' + bVar7) * '\x02' - (bVar1 < 0x9f)) + 0xa0;
          iVar3 = iVar4 + 2;
          __dest[(long)iVar4 + 1] = bVar9 + bVar1 + 0x80;
        }
        bVar7 = __src[(long)iVar5 + 1];
      } while ((bVar7 != 0) && (lVar6 = (long)iVar5 + 1, iVar4 = iVar3, iVar3 < 0x2000));
      goto LAB_00123154;
    }
  }
  iVar3 = 0;
LAB_00123154:
  if (iVar3 < 0x2000) {
    __dest[iVar3] = '\0';
    return;
  }
  gd_error("output buffer overflow at do_convert()");
  strcpy((char *)__dest,(char *)__src);
  return;
}

Assistant:

static void
do_convert (unsigned char **to_p, unsigned char **from_p, const char *code)
{
	unsigned char *to = *to_p;
	unsigned char *from = *from_p;
#ifdef HAVE_ICONV
	iconv_t cd;
	size_t from_len, to_len;

	if ((cd = iconv_open (EUCSTR, code)) == (iconv_t) - 1) {
		gd_error ("iconv_open() error");
#ifdef HAVE_ERRNO_H
		if (errno == EINVAL)
			gd_error ("invalid code specification: \"%s\" or \"%s\"", EUCSTR, code);
#endif
		ustrcpy (to, from);
		return;
	}

	from_len = strlen ((const char *)from) + 1;
	to_len = BUFSIZ;

	if ((int) (iconv (cd, (char **)from_p, &from_len, (char **)to_p, &to_len))
	        == -1) {
#ifdef HAVE_ERRNO_H
		if (errno == EINVAL)
			gd_error ("invalid end of input string");
		else if (errno == EILSEQ)
			gd_error ("invalid code in input string");
		else if (errno == E2BIG)
			gd_error ("output buffer overflow at do_convert()");
		else
#endif
			gd_error ("something happen");
		ustrcpy (to, from);
		return;
	}

	if (iconv_close (cd) != 0) {
		gd_error ("iconv_close() error");
	}
#else
	int p1, p2, i, j;
	int jisx0208 = FALSE;
	int hankaku = FALSE;

	j = 0;
	if (strcmp (code, NEWJISSTR) == 0 || strcmp (code, OLDJISSTR) == 0) {
		for (i = 0; from[i] != '\0' && j < BUFSIZ; i++) {
			if (from[i] == ESC) {
				i++;
				if (from[i] == '$') {
					jisx0208 = TRUE;
					hankaku = FALSE;
					i++;
				} else if (from[i] == '(') {
					jisx0208 = FALSE;
					i++;
					if (from[i] == 'I')	/* Hankaku Kana */
						hankaku = TRUE;
					else
						hankaku = FALSE;
				}
			} else {
				if (jisx0208)
					to[j++] = from[i] + 128;
				else if (hankaku) {
					to[j++] = SS2;
					to[j++] = from[i] + 128;
				} else
					to[j++] = from[i];
			}
		}
	} else if (strcmp (code, SJISSTR) == 0) {
		for (i = 0; from[i] != '\0' && j < BUFSIZ; i++) {
			p1 = from[i];
			if (p1 < 127)
				to[j++] = p1;
			else if ((p1 >= 161) && (p1 <= 223)) {
				/* Hankaku Kana */
				to[j++] = SS2;
				to[j++] = p1;
			} else {
				p2 = from[++i];
				SJIStoJIS (&p1, &p2);
				to[j++] = p1 + 128;
				to[j++] = p2 + 128;
			}
		}
	} else {
		gd_error ("invalid code specification: \"%s\"", code);
		return;
	}

	if (j >= BUFSIZ) {
		gd_error ("output buffer overflow at do_convert()");
		ustrcpy (to, from);
	} else
		to[j] = '\0';
#endif /* HAVE_ICONV */
}